

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

void freedirs(ftp_conn *ftpc)

{
  int local_14;
  int i;
  ftp_conn *ftpc_local;
  
  if (ftpc->dirs != (char **)0x0) {
    for (local_14 = 0; local_14 < ftpc->dirdepth; local_14 = local_14 + 1) {
      (*Curl_cfree)(ftpc->dirs[local_14]);
      ftpc->dirs[local_14] = (char *)0x0;
    }
    (*Curl_cfree)(ftpc->dirs);
    ftpc->dirs = (char **)0x0;
    ftpc->dirdepth = 0;
  }
  (*Curl_cfree)(ftpc->file);
  ftpc->file = (char *)0x0;
  (*Curl_cfree)(ftpc->newhost);
  ftpc->newhost = (char *)0x0;
  return;
}

Assistant:

static void freedirs(struct ftp_conn *ftpc)
{
  if(ftpc->dirs) {
    int i;
    for(i = 0; i < ftpc->dirdepth; i++) {
      free(ftpc->dirs[i]);
      ftpc->dirs[i] = NULL;
    }
    free(ftpc->dirs);
    ftpc->dirs = NULL;
    ftpc->dirdepth = 0;
  }
  Curl_safefree(ftpc->file);

  /* no longer of any use */
  Curl_safefree(ftpc->newhost);
}